

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O0

void show_dir_errno(GlobalConfig *global,char *name)

{
  int iVar1;
  int *piVar2;
  char *name_local;
  GlobalConfig *global_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 == 0xd) {
    errorf(global,"You do not have permission to create %s",name);
  }
  else if (iVar1 == 0x1c) {
    errorf(global,"No space left on the file system that will contain the directory %s",name);
  }
  else if (iVar1 == 0x1e) {
    errorf(global,"%s resides on a read-only file system",name);
  }
  else if (iVar1 == 0x24) {
    errorf(global,"The directory name %s is too long",name);
  }
  else if (iVar1 == 0x7a) {
    errorf(global,"Cannot create directory %s because you exceeded your quota",name);
  }
  else {
    errorf(global,"Error creating directory %s",name);
  }
  return;
}

Assistant:

static void show_dir_errno(struct GlobalConfig *global, const char *name)
{
  switch(errno) {
#ifdef EACCES
  case EACCES:
    errorf(global, "You do not have permission to create %s", name);
    break;
#endif
#ifdef ENAMETOOLONG
  case ENAMETOOLONG:
    errorf(global, "The directory name %s is too long", name);
    break;
#endif
#ifdef EROFS
  case EROFS:
    errorf(global, "%s resides on a read-only file system", name);
    break;
#endif
#ifdef ENOSPC
  case ENOSPC:
    errorf(global, "No space left on the file system that will "
           "contain the directory %s", name);
    break;
#endif
#ifdef EDQUOT
  case EDQUOT:
    errorf(global, "Cannot create directory %s because you "
           "exceeded your quota", name);
    break;
#endif
  default:
    errorf(global, "Error creating directory %s", name);
    break;
  }
}